

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper3.cpp
# Opt level: O0

void test_cpp_wrapper_all_records_random(planck_unit_test_t *tc,Dictionary<int,_int> *dict)

{
  int local_40;
  int i;
  int records_length;
  int records [5];
  Dictionary<int,_int> *dict_local;
  planck_unit_test_t *tc_local;
  
  _i = 0x71ffffff91;
  records[0] = 5;
  records[1] = 0x32;
  records[2] = -0xe1;
  for (local_40 = 0; local_40 < 5; local_40 = local_40 + 1) {
    cpp_wrapper_insert(tc,dict,(&i)[local_40],(&i)[local_40],'\x01');
  }
  cpp_wrapper_all_records(tc,dict,&i,5,'\x01');
  return;
}

Assistant:

void
test_cpp_wrapper_all_records_random(
	planck_unit_test_t *tc,
	Dictionary<int, int> *dict
) {
	int records[5]		= { -111, 113, 5, 50, -225 };
	int records_length	= sizeof(records) / sizeof(int);

	for (int i = 0; i < records_length; i++) {
		cpp_wrapper_insert(tc, dict, records[i], records[i], boolean_true);
	}

	cpp_wrapper_all_records(tc, dict, records, records_length, boolean_true);
}